

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

int compute_minrun(uint64_t size)

{
  long lVar1;
  byte bVar2;
  int local_2c;
  uint64_t mask;
  int minrun;
  int shift;
  int top_bit;
  uint64_t size_local;
  int local_4;
  
  lVar1 = 0x3f;
  if (size != 0) {
    for (; size >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  local_2c = 0x40 - ((uint)lVar1 ^ 0x3f);
  if (local_2c < 7) {
    local_2c = 6;
  }
  bVar2 = (char)local_2c - 6;
  local_4 = (int)(size >> (bVar2 & 0x3f));
  if (((1L << (bVar2 & 0x3f)) - 1U & size) != 0) {
    local_4 = local_4 + 1;
  }
  return local_4;
}

Assistant:

static __inline int compute_minrun(const uint64_t size) {
  const int top_bit = 64 - CLZ(size);
  const int shift = MAX(top_bit, 6) - 6;
  const int minrun = (int)(size >> shift);
  const uint64_t mask = (1ULL << shift) - 1;

  if (mask & size) {
    return minrun + 1;
  }

  return minrun;
}